

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O2

void __thiscall
libchars::command::command
          (command *this,string *cmd_str_,char *name_,filter_t mask_,id_t ID_,bool hidden_)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->ID = ID_;
  std::__cxx11::string::string((string *)&this->cmd_str,(string *)cmd_str_);
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  (this->help)._M_string_length = 0;
  (this->help).field_2._M_local_buf[0] = '\0';
  (this->par).super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->par).super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->par).super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mask = mask_;
  this->hidden = hidden_;
  this->next = (command *)0x0;
  if (name_ != (char *)0x0) {
    std::__cxx11::string::assign((char *)this);
  }
  return;
}

Assistant:

command::command(const std::string &cmd_str_, const char *name_, filter_t mask_, token::id_t ID_, bool hidden_) :
        ID(ID_),cmd_str(cmd_str_),mask(mask_),hidden(hidden_),next(NULL)
    {
        if (name_ != NULL)
            name.assign(name_);
    }